

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void google::protobuf::internal::SwapFieldHelper::SwapNonMessageNonStringField
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  unsigned_long uVar5;
  uint *puVar6;
  uint *puVar7;
  unsigned_long *puVar8;
  unsigned_long *puVar9;
  bool *pbVar10;
  bool *pbVar11;
  double *pdVar12;
  double *pdVar13;
  float *pfVar14;
  float *pfVar15;
  LogMessage *this;
  CppType local_34;
  LogMessage local_30;
  
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
  case 8:
    puVar6 = (uint *)Reflection::MutableRaw<int>(r,lhs,field);
    puVar7 = (uint *)Reflection::MutableRaw<int>(r,rhs,field);
    goto LAB_00213245;
  case 2:
    puVar8 = (unsigned_long *)Reflection::MutableRaw<long>(r,lhs,field);
    puVar9 = (unsigned_long *)Reflection::MutableRaw<long>(r,rhs,field);
    goto LAB_00213216;
  case 3:
    puVar6 = Reflection::MutableRaw<unsigned_int>(r,lhs,field);
    puVar7 = Reflection::MutableRaw<unsigned_int>(r,rhs,field);
LAB_00213245:
    uVar4 = *puVar6;
    *puVar6 = *puVar7;
    *puVar7 = uVar4;
    break;
  case 4:
    puVar8 = Reflection::MutableRaw<unsigned_long>(r,lhs,field);
    puVar9 = Reflection::MutableRaw<unsigned_long>(r,rhs,field);
LAB_00213216:
    uVar5 = *puVar8;
    *puVar8 = *puVar9;
    *puVar9 = uVar5;
    break;
  case 5:
    pdVar12 = Reflection::MutableRaw<double>(r,lhs,field);
    pdVar13 = Reflection::MutableRaw<double>(r,rhs,field);
    dVar2 = *pdVar12;
    *pdVar12 = *pdVar13;
    *pdVar13 = dVar2;
    break;
  case 6:
    pfVar14 = Reflection::MutableRaw<float>(r,lhs,field);
    pfVar15 = Reflection::MutableRaw<float>(r,rhs,field);
    fVar1 = *pfVar14;
    *pfVar14 = *pfVar15;
    *pfVar15 = fVar1;
    break;
  case 7:
    pbVar10 = Reflection::MutableRaw<bool>(r,lhs,field);
    pbVar11 = Reflection::MutableRaw<bool>(r,rhs,field);
    bVar3 = *pbVar10;
    *pbVar10 = *pbVar11;
    *pbVar11 = bVar3;
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x370);
    this = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&local_30,(char (*) [21])"Unimplemented type: ");
    local_34 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
    absl::lts_20250127::log_internal::LogMessage::
    operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>(this,&local_34);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  return;
}

Assistant:

void SwapFieldHelper::SwapNonMessageNonStringField(
    const Reflection* r, Message* lhs, Message* rhs,
    const FieldDescriptor* field) {
  switch (field->cpp_type()) {
#define SWAP_VALUES(CPPTYPE, TYPE)               \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:       \
    std::swap(*r->MutableRaw<TYPE>(lhs, field),  \
              *r->MutableRaw<TYPE>(rhs, field)); \
    break;

    SWAP_VALUES(INT32, int32_t);
    SWAP_VALUES(INT64, int64_t);
    SWAP_VALUES(UINT32, uint32_t);
    SWAP_VALUES(UINT64, uint64_t);
    SWAP_VALUES(FLOAT, float);
    SWAP_VALUES(DOUBLE, double);
    SWAP_VALUES(BOOL, bool);
    SWAP_VALUES(ENUM, int);
#undef SWAP_VALUES
    default:
      ABSL_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
  }
}